

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O3

bool __thiscall QFSFileEngine::setPermissions(QFSFileEngine *this,uint perms)

{
  QAbstractFileEnginePrivate *pQVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QString local_38;
  QSystemError local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  local_20.errorCode = 0;
  local_20.errorScope = NoError;
  *(uint *)&pQVar1[2].errorString.d.d = *(uint *)&pQVar1[2].errorString.d.d & 0xffff8888;
  if (*(int *)&pQVar1[3].q_ptr == -1) {
    bVar2 = QFileSystemEngine::setPermissions
                      ((QFileSystemEntry *)(pQVar1 + 1),(Permissions)perms,&local_20);
  }
  else {
    bVar2 = QFileSystemEngine::setPermissions(*(int *)&pQVar1[3].q_ptr,(Permissions)perms,&local_20)
    ;
  }
  bVar3 = true;
  if (bVar2 == false) {
    QSystemError::string(&local_38,local_20.errorScope,local_20.errorCode);
    QAbstractFileEngine::setError(&this->super_QAbstractFileEngine,PermissionsError,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::setPermissions(uint perms)
{
    Q_D(QFSFileEngine);
    QSystemError error;
    bool ok;

    // clear cached state (if any)
    d->metaData.clearFlags(QFileSystemMetaData::Permissions);

    if (d->fd != -1)
        ok = QFileSystemEngine::setPermissions(d->fd, QFile::Permissions(perms), error);
    else
        ok = QFileSystemEngine::setPermissions(d->fileEntry, QFile::Permissions(perms), error);
    if (!ok) {
        setError(QFile::PermissionsError, error.toString());
        return false;
    }
    return true;
}